

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::RecoverFromResetCase::iterate(RecoverFromResetCase *this)

{
  EGLConfig *config;
  EGLDisplay *display;
  glActiveTextureFunc *pp_Var1;
  EGLint **this_00;
  ShaderType SVar2;
  EglTestContext *pEVar3;
  InfiniteLoop *this_01;
  EGLContext local_1c58 [4];
  EGLint attribList [9];
  RenderingContext contextA;
  RenderingContext contextB;
  Functions gl;
  
  pEVar3 = (EglTestContext *)
           ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pEVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,
                  "Provoke a context reset and wait for glGetGraphicsResetStatus() to return NO_ERROR_KHR.\n"
                 );
  std::operator<<((ostream *)pp_Var1,
                  "Destroy the old context and successfully create a new context.\n\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  attribList[4] = 0x30bf;
  attribList[5] = 1;
  attribList[6] = 0x3138;
  attribList[7] = 0x31bf;
  attribList[0] = 0x3098;
  attribList[1] = 3;
  attribList[2] = 0x30fb;
  attribList[3] = 1;
  attribList[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,attribList);
  pp_Var1 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pEVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pp_Var1);
  std::operator<<((ostream *)pp_Var1,"Create context A");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pp_Var1);
  config = &(this->super_RobustnessTestCase).m_eglConfig;
  display = &(this->super_RobustnessTestCase).m_eglDisplay;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x0;
  RenderingContext::RenderingContext
            (&contextA,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribList,
             config,display,&gl.activeShaderProgram);
  RenderingContext::makeCurrent(&contextA,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions(&gl);
  RenderingContext::initGLFunctions(&contextA,&gl);
  checkRequiredGLRobustnessExtension(attribList,&gl);
  this_01 = (InfiniteLoop *)operator_new(0x48);
  SVar2 = (this->super_RobustnessTestCase).m_params.m_shaderType;
  (this_01->super_ContextReset).m_gl = &gl;
  (this_01->super_ContextReset).m_log = (TestLog *)pEVar3;
  (this_01->super_ContextReset).m_shaderType = SVar2;
  (this_01->super_ContextReset)._vptr_ContextReset = (_func_int **)&PTR__InfiniteLoop_01e0b2f0;
  this_01->m_outputBuffer = 0;
  this_01->m_coordinatesBuffer = 0;
  this_01->m_coordLocation = 0;
  InfiniteLoop::setup(this_01);
  (*(this_01->super_ContextReset)._vptr_ContextReset[3])(this_01);
  (*(this_01->super_ContextReset)._vptr_ContextReset[4])(this_01);
  ContextReset::finish((ContextReset *)this_01);
  this_00 = &contextB.m_attribList;
  contextB.m_eglTestCtx = pEVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Create context B");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&contextB,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  local_1c58[0] = (EGLContext)0x0;
  RenderingContext::RenderingContext
            (&contextB,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribList,
             config,display,local_1c58);
  RenderingContext::~RenderingContext(&contextB);
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,QP_TEST_RESULT_PASS,"Pass");
  (*(this_01->super_ContextReset)._vptr_ContextReset[1])(this_01);
  RenderingContext::~RenderingContext(&contextA);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Provoke a context reset and wait for glGetGraphicsResetStatus() to return NO_ERROR_KHR.\n"
			<< "Destroy the old context and successfully create a new context.\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		log << tcu::TestLog::Message << "Create context A" << tcu::TestLog::EndMessage;
		RenderingContext contextA(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		contextA.makeCurrent(m_eglSurface);

		glw::Functions gl;
		contextA.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		DE_ASSERT(m_params.getContextResetType() == CONTEXTRESETTYPE_INFINITE_LOOP);
		de::UniquePtr<ContextReset> contextReset(new InfiniteLoop(gl, log, m_params.getShaderType()));

		contextReset->setup();
		contextReset->draw();

		try
		{
			contextReset->teardown();
			contextReset->finish();
		}
		catch (const glu::Error& error)
		{
			if (error.getError() == GL_CONTEXT_LOST)
			{
				const glw::GLint status = gl.getGraphicsResetStatus();
				if (status == GL_NO_ERROR)
				{
					log << tcu::TestLog::Message
						<< "Test failed! glGetGraphicsResetStatus() returned wrong value [" << glu::getErrorStr(status) << ", expected " << glu::getErrorStr(GL_GUILTY_CONTEXT_RESET) << "]"
						<< tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}

				const int	sleepTimeMs		= 1000;				// (1 second)
				int			timeout			= sleepTimeMs * 10; // (10 seconds)
				int			reset_status	= -1;

				// wait for context to reset
				while ((reset_status = gl.getGraphicsResetStatus() != GL_NO_ERROR) && timeout > 0)
				{
					deSleep(sleepTimeMs);
					timeout -= sleepTimeMs;
				}

				if (reset_status != GL_NO_ERROR)
				{
					log	<< tcu::TestLog::Message
						<< "Test failed! Context did not reset. glGetGraphicsResetStatus() returned wrong value [" << glu::getErrorStr(reset_status) << ", expected " << glu::getErrorStr(GL_NO_ERROR) << "]"
						<< tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! glGetError() returned wrong value. Expected GL_CONTEXT_LOST in context A");
				return STOP;
			}
		}

		try
		{
			log << tcu::TestLog::Message << "Create context B" << tcu::TestLog::EndMessage;
			RenderingContext contextB(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		}
		catch (const glu::Error&)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Test failed! Could not create new context. glGetError() returned wrong value. Expected GL_NO_ERROR");
			return STOP;
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}